

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfutureinterface.cpp
# Opt level: O0

void __thiscall
QFutureInterfaceBase::reportException(QFutureInterfaceBase *this,exception_ptr *exception)

{
  long lVar1;
  uint uVar2;
  QFutureCallOutEvent *in_RSI;
  QFutureInterfaceBasePrivate *in_RDI;
  long in_FS_OFFSET;
  QMutexLocker<QMutex> locker;
  int in_stack_ffffffffffffff68;
  CallOutType in_stack_ffffffffffffff6c;
  QFutureCallOutEvent *in_stack_ffffffffffffff70;
  exception_ptr *in_stack_ffffffffffffff88;
  Data *in_stack_ffffffffffffff90;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QMutexLocker<QMutex>::QMutexLocker
            ((QMutexLocker<QMutex> *)in_stack_ffffffffffffff70,
             (QMutex *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  uVar2 = QBasicAtomicInteger<int>::loadRelaxed((QBasicAtomicInteger<int> *)0x6ddb19);
  if ((uVar2 & 0xc) == 0) {
    (in_RDI->continuationMutex).d_ptr._q_value._M_b._M_p[0xd6] = (QMutexPrivate)0x1;
    QFutureInterfaceBasePrivate::Data::setException
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    switch_on((QAtomicInt *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
    QWaitCondition::wakeAll((QWaitCondition *)in_stack_ffffffffffffff70);
    QWaitCondition::wakeAll((QWaitCondition *)in_stack_ffffffffffffff70);
    in_stack_ffffffffffffff70 =
         (QFutureCallOutEvent *)(in_RDI->continuationMutex).d_ptr._q_value._M_b._M_p;
    QFutureCallOutEvent::QFutureCallOutEvent
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
    QFutureInterfaceBasePrivate::sendCallOut(in_RDI,in_RSI);
    QFutureCallOutEvent::~QFutureCallOutEvent(in_stack_ffffffffffffff70);
  }
  QMutexLocker<QMutex>::~QMutexLocker((QMutexLocker<QMutex> *)in_stack_ffffffffffffff70);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFutureInterfaceBase::reportException(const std::exception_ptr &exception)
#endif
{
    QMutexLocker locker(&d->m_mutex);
    if (d->state.loadRelaxed() & (Canceled|Finished))
        return;

    d->hasException = true;
    d->data.setException(exception);
    switch_on(d->state, Canceled);
    d->waitCondition.wakeAll();
    d->pausedWaitCondition.wakeAll();
    d->sendCallOut(QFutureCallOutEvent(QFutureCallOutEvent::Canceled));
}